

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O0

void __thiscall
TPZFrontSym<double>::AddKel
          (TPZFrontSym<double> *this,TPZFMatrix<double> *elmat,TPZVec<long> *destinationindex)

{
  int iVar1;
  TPZFrontSym<double> *this_00;
  TPZFMatrix<double> *this_01;
  double *pdVar2;
  TPZVec<long> *in_RDX;
  int64_t in_RDI;
  int64_t nel;
  int64_t jlocal;
  int64_t ilocal;
  int64_t j;
  int64_t i;
  double j_00;
  TPZFrontSym<double> *in_stack_ffffffffffffffc8;
  undefined8 local_28;
  undefined8 local_20;
  
  this_00 = (TPZFrontSym<double> *)TPZVec<long>::NElements(in_RDX);
  for (local_20 = 0; local_20 < (long)this_00; local_20 = local_20 + 1) {
    TPZVec<long>::operator[](in_RDX,local_20);
    iVar1 = Local(in_stack_ffffffffffffffc8,(int64_t)this_00);
    this_01 = (TPZFMatrix<double> *)(long)iVar1;
    for (local_28 = local_20; local_28 < (long)this_00; local_28 = local_28 + 1) {
      TPZVec<long>::operator[](in_RDX,local_28);
      iVar1 = Local(in_stack_ffffffffffffffc8,(int64_t)this_00);
      in_stack_ffffffffffffffc8 = (TPZFrontSym<double> *)(long)iVar1;
      pdVar2 = TPZFMatrix<double>::operator()
                         (this_01,(int64_t)in_stack_ffffffffffffffc8,(int64_t)this_00);
      j_00 = *pdVar2;
      pdVar2 = Element(this_00,in_RDI,(int64_t)j_00);
      *pdVar2 = j_00 + *pdVar2;
    }
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel = destinationindex.NElements();
	for(i=0;i<nel;i++){
		ilocal = this->Local(destinationindex[i]);
		for(j=i;j<nel;j++) {
			jlocal=this->Local(destinationindex[j]);
			this->Element(ilocal, jlocal)+=elmat(i,j);
		}
	}
	/*
	 output << "Dest Index " ;
	 for(i=0;i<nel;i++) output << destinationindex[i] << " ";
	 output << endl;
	 elmat.Print("Element matrix ",output);
	 PrintGlobal("After Assemb..." , output);
	 */
}